

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"xfb_functional",
             "Transform Feedback Functional Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0212cd90;
  this->m_gl_getTransformFeedbackiv = (GetTransformFeedbackiv_ProcAddress)0x0;
  this->m_gl_TransformFeedbackBufferBase = (TransformFeedbackBufferBase_ProcAddress)0x0;
  this->m_xfb_dsa = 0;
  this->m_bo = 0;
  this->m_po = 0;
  this->m_vao = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "xfb_functional", "Transform Feedback Functional Test")
	, m_gl_getTransformFeedbackiv(DE_NULL)
	, m_gl_TransformFeedbackBufferBase(DE_NULL)
	, m_xfb_dsa(0)
	, m_bo(0)
	, m_po(0)
	, m_vao(0)
{
	/* Intentionally left blank. */
}